

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O0

Polygon * __thiscall iDynTree::Polygon::applyTransform(Polygon *this,Transform *newFrame_X_oldFrame)

{
  ulong uVar1;
  size_t sVar2;
  Position *in_RDX;
  Polygon *in_RSI;
  Polygon *in_RDI;
  size_t i;
  Polygon *ret;
  Position *in_stack_ffffffffffffff78;
  Polygon *in_stack_ffffffffffffff80;
  Position *this_00;
  Transform local_50 [24];
  ulong local_38;
  undefined1 local_19;
  Position *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  Polygon(in_RSI);
  getNrOfVertices((Polygon *)0x152214);
  setNrOfVertices(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  for (local_38 = 0; uVar1 = local_38, sVar2 = getNrOfVertices((Polygon *)0x152240), uVar1 < sVar2;
      local_38 = local_38 + 1) {
    this_00 = local_18;
    operator()((Polygon *)local_18,(size_t)in_stack_ffffffffffffff78);
    iDynTree::Transform::operator*(local_50,this_00);
    in_stack_ffffffffffffff78 = operator()((Polygon *)this_00,(size_t)in_stack_ffffffffffffff78);
    iDynTree::Position::operator=(in_stack_ffffffffffffff78,(Position *)local_50);
  }
  return in_RDI;
}

Assistant:

Polygon Polygon::applyTransform(const Transform &newFrame_X_oldFrame) const
    {
        Polygon ret;

        assert(this->isValid());

        ret.setNrOfVertices(this->getNrOfVertices());

        for (size_t i=0; i < this->getNrOfVertices(); i++)
        {
            ret(i) = newFrame_X_oldFrame*this->operator()(i);
        }

        return ret;
    }